

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O3

int __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::GetSuffixSize
          (BasicProblem<mp::BasicProblemParams<int>_> *this,Kind kind)

{
  switch(kind & PROBLEM) {
  case VAR:
    return (int)((long)(this->vars_).
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)(this->vars_).
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  case CON:
    return (int)((long)(this->logical_cons_).
                       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)(this->logical_cons_).
                       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) +
           (int)((long)(this->algebraic_cons_).
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)(this->algebraic_cons_).
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f;
  case OBJ:
    return (int)((long)(this->linear_objs_).
                       super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                 (long)(this->linear_objs_).
                       super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x11111111;
  case PROBLEM:
    return 1;
  }
}

Assistant:

int BasicProblem<Alloc>::GetSuffixSize(suf::Kind kind) {
  std::size_t size = 0;
  switch (kind & suf::KIND_MASK) {
  default:
    MP_ASSERT(false, "invalid suffix kind");
    // Fall through.
  case suf::VAR:
    size = vars_.capacity();
    break;
  case suf::CON:
    size = algebraic_cons_.capacity() +
        logical_cons_.capacity();
    break;
  case suf::OBJ:
    size = linear_objs_.capacity();
    break;
  case suf::PROBLEM:
    size = 1;
    break;
  }
  return static_cast<int>(size);
}